

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void SequentializeParallelCopies(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  VmBlock *block;
  VmInstruction *p;
  
  for (block = function->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
    for (p = block->firstInstruction; p != (VmInstruction *)0x0; p = p->nextSibling) {
      if (p->cmd == VM_INST_PARALLEL_COPY) {
        module->currentBlock = block;
        block->insertPoint = p;
        SequentializeParallelCopy(module,p);
        module->currentBlock = (VmBlock *)0x0;
        block->insertPoint = block->lastInstruction;
      }
    }
    RunDeadCodeElimiation(ctx,module,block);
  }
  return;
}

Assistant:

void SequentializeParallelCopies(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PARALLEL_COPY)
			{
				module->currentBlock = block;
				block->insertPoint = inst;

				SequentializeParallelCopy(module, inst);

				module->currentBlock = NULL;
				block->insertPoint = block->lastInstruction;
			}
		}

		RunDeadCodeElimiation(ctx, module, block);
	}
}